

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

void __thiscall QTextDocumentPrivate::appendUndoItem(QTextDocumentPrivate *this,QTextUndoCommand *c)

{
  QList<QTextUndoCommand> *this_00;
  byte bVar1;
  quint32 qVar2;
  QTextUndoCommand *pQVar3;
  bool bVar4;
  pointer pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QTextUndoCommand local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->undoEnabled == true) {
    if ((long)this->undoState < (this->undoStack).d.size) {
      clearUndoRedoStacks(this,RedoStack,false);
    }
    this_00 = &this->undoStack;
    if (((this->editBlock != 0) && (qVar2 = this->editBlockCursorPosition, -1 < (int)qVar2)) &&
       (c->pos != qVar2)) {
      local_48.command = 9;
      local_48._2_1_ = 1;
      local_48.operation = '\x01';
      local_48.format = 0;
      local_48.strPos = 0;
      local_48.field_8.custom = (QAbstractUndoItem *)0xaaaaaaaa00000000;
      local_48.revision = 0;
      local_48._28_4_ = 0xaaaaaaaa;
      local_48.pos = qVar2;
      QtPrivate::QPodArrayOps<QTextUndoCommand>::emplace<QTextUndoCommand_const&>
                ((QPodArrayOps<QTextUndoCommand> *)this_00,(this->undoStack).d.size,&local_48);
      QList<QTextUndoCommand>::end(this_00);
      this->undoState = this->undoState + 1;
      this->editBlockCursorPosition = -1;
    }
    if (((this->undoStack).d.size != 0) && (this->modified == true)) {
      lVar6 = (long)this->undoState + -1;
      pQVar3 = (this->undoStack).d.ptr;
      bVar1 = pQVar3[lVar6].field_0x2;
      if ((((bVar1 & 1) != 0) && (((bVar1 & 2) == 0 && ((c->field_0x2 & 1) != 0)))) ||
         ((((c->field_0x2 | bVar1) & 1) == 0 ||
          (((((c->field_0x2 & 1) == 0 && ((bVar1 & 1) != 0)) && (c->command == 0)) &&
           (pQVar3[lVar6].command == 0)))))) {
        pQVar5 = QList<QTextUndoCommand>::data(this_00);
        bVar4 = QTextUndoCommand::tryMerge(pQVar5 + lVar6,c);
        if (bVar4) goto LAB_004db878;
      }
    }
    if (this->undoState < this->modifiedState) {
      this->modifiedState = -1;
    }
    QtPrivate::QPodArrayOps<QTextUndoCommand>::emplace<QTextUndoCommand_const&>
              ((QPodArrayOps<QTextUndoCommand> *)this_00,(this->undoStack).d.size,c);
    QList<QTextUndoCommand>::end(this_00);
    this->undoState = this->undoState + 1;
    if (this->wasUndoAvailable == false) {
      QTextDocument::undoAvailable(*(QTextDocument **)&this->field_0x8,true);
      this->wasUndoAvailable = true;
    }
    if (this->wasRedoAvailable != false) {
      QTextDocument::redoAvailable(*(QTextDocument **)&this->field_0x8,false);
      this->wasRedoAvailable = false;
    }
    if ((c->field_0x2 & 1) == 0) {
      QTextDocument::undoCommandAdded(*(QTextDocument **)&this->field_0x8);
    }
  }
LAB_004db878:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::appendUndoItem(const QTextUndoCommand &c)
{
    PMDEBUG("appendUndoItem, command=%d enabled=%d", c.command, undoEnabled);
    if (!undoEnabled)
        return;
    if (undoState < undoStack.size())
        clearUndoRedoStacks(QTextDocument::RedoStack);

    if (editBlock != 0 && editBlockCursorPosition >= 0) { // we had a beginEditBlock() with a cursor position
        if (q20::cmp_not_equal(c.pos, editBlockCursorPosition)) { // and that cursor position is different from the command
            // generate a CursorMoved undo item
            QT_INIT_TEXTUNDOCOMMAND(cc, QTextUndoCommand::CursorMoved, true, QTextUndoCommand::MoveCursor,
                                    0, 0, editBlockCursorPosition, 0, 0);
            undoStack.append(cc);
            undoState++;
            editBlockCursorPosition = -1;
        }
    }


    if (!undoStack.isEmpty() && modified) {
        const int lastIdx = undoState - 1;
        const QTextUndoCommand &last = undoStack.at(lastIdx);

        if ( (last.block_part && c.block_part && !last.block_end) // part of the same block => can merge
            || (!c.block_part && !last.block_part) // two single undo items => can merge
            || (c.command == QTextUndoCommand::Inserted && last.command == c.command && (last.block_part && !c.block_part))) {
            // two sequential inserts that are not part of the same block => can merge
            if (undoStack[lastIdx].tryMerge(c))
                return;
        }
    }
    if (modifiedState > undoState)
        modifiedState = -1;
    undoStack.append(c);
    undoState++;
    emitUndoAvailable(true);
    emitRedoAvailable(false);

    if (!c.block_part)
        emit document()->undoCommandAdded();
}